

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

type __thiscall
fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
::operator()(printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
             *this,wchar_t value)

{
  char cVar1;
  format_specs *pfVar2;
  type tVar3;
  
  pfVar2 = (this->
           super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           ).specs_;
  cVar1 = (pfVar2->super_core_format_specs).type;
  if ((cVar1 != '\0') && (cVar1 != 'c')) {
    tVar3 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)this,value);
    return (type)tVar3.container;
  }
  (pfVar2->super_core_format_specs).flags = '\0';
  (pfVar2->super_align_spec).align_ = ALIGN_RIGHT;
  tVar3 = internal::
          arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
          operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                      *)this,value);
  return (type)tVar3.container;
}

Assistant:

format_specs *spec() { return specs_; }